

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O3

bool duckdb::ParquetStatisticsUtils::BloomFilterExcludes
               (TableFilter *duckdb_filter,ColumnMetaData *column_meta_data,TProtocol *file_proto,
               Allocator *allocator)

{
  ThriftFileTransport *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  pointer pRVar2;
  Allocator *__nbytes;
  void *__buf;
  idx_t pos;
  templated_unique_single_t new_buffer;
  ParquetBloomFilter bloom_filter;
  BloomFilterHeader filter_header;
  __uniq_ptr_impl<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_> local_a0
  ;
  _Head_base<0UL,_duckdb::ResizeableBuffer_*,_false> local_98;
  ParquetBloomFilter local_90;
  BloomFilterHeader local_80;
  
  __nbytes = allocator;
  bVar1 = HasFilterConstants(duckdb_filter);
  if (((bVar1) && (((byte)column_meta_data->__isset & 0x20) != 0)) &&
     (pos = column_meta_data->bloom_filter_offset, 0 < (long)pos)) {
    this = (ThriftFileTransport *)
           (file_proto->ptrans_).
           super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    this_00 = (file_proto->ptrans_).
              super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      pos = column_meta_data->bloom_filter_offset;
    }
    this->location = pos;
    if ((((byte)column_meta_data->__isset & 0x40) != 0) &&
       (0 < (long)column_meta_data->bloom_filter_length)) {
      ThriftFileTransport::Prefetch(this,pos,(long)column_meta_data->bloom_filter_length);
    }
    duckdb_parquet::BloomFilterHeader::BloomFilterHeader(&local_80);
    duckdb_parquet::BloomFilterHeader::read(&local_80,(int)file_proto,__buf,(size_t)__nbytes);
    if (((((byte)local_80.algorithm.__isset & 1) == 0) ||
        (((byte)local_80.compression.__isset & 1) == 0)) || (((byte)local_80.hash.__isset & 1) == 0)
       ) {
      bVar1 = false;
    }
    else {
      make_uniq<duckdb::ResizeableBuffer,duckdb::Allocator&,int&>
                ((duckdb *)&local_a0,allocator,&local_80.numBytes);
      pRVar2 = unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
               ::operator->((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
                             *)&local_a0);
      ThriftFileTransport::read
                (this,(int)(pRVar2->super_ByteBuffer).ptr,(void *)(ulong)(uint)local_80.numBytes,
                 (size_t)__nbytes);
      local_98._M_head_impl =
           (ResizeableBuffer *)
           local_a0._M_t.
           super__Tuple_impl<0UL,_duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>
           .super__Head_base<0UL,_duckdb::ResizeableBuffer_*,_false>._M_head_impl;
      local_a0._M_t.
      super__Tuple_impl<0UL,_duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>
      .super__Head_base<0UL,_duckdb::ResizeableBuffer_*,_false>._M_head_impl =
           (tuple<duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>)
           (_Tuple_impl<0UL,_duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>
            )0x0;
      ParquetBloomFilter::ParquetBloomFilter
                (&local_90,
                 (unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
                  *)&local_98);
      std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)&local_98);
      bVar1 = ApplyBloomFilter(duckdb_filter,&local_90);
      std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)&local_90);
      std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)&local_a0);
    }
    duckdb_parquet::BloomFilterHeader::~BloomFilterHeader(&local_80);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ParquetStatisticsUtils::BloomFilterExcludes(const TableFilter &duckdb_filter,
                                                 const duckdb_parquet::ColumnMetaData &column_meta_data,
                                                 TProtocol &file_proto, Allocator &allocator) {
	if (!HasFilterConstants(duckdb_filter) || !column_meta_data.__isset.bloom_filter_offset ||
	    column_meta_data.bloom_filter_offset <= 0) {
		return false;
	}
	// TODO check length against file length!

	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto.getTransport());
	transport.SetLocation(column_meta_data.bloom_filter_offset);
	if (column_meta_data.__isset.bloom_filter_length && column_meta_data.bloom_filter_length > 0) {
		transport.Prefetch(column_meta_data.bloom_filter_offset, column_meta_data.bloom_filter_length);
	}

	duckdb_parquet::BloomFilterHeader filter_header;
	// TODO the bloom filter could be encrypted, too, so need to double check that this is NOT the case
	filter_header.read(&file_proto);
	if (!filter_header.algorithm.__isset.BLOCK || !filter_header.compression.__isset.UNCOMPRESSED ||
	    !filter_header.hash.__isset.XXHASH) {
		return false;
	}

	auto new_buffer = make_uniq<ResizeableBuffer>(allocator, filter_header.numBytes);
	transport.read(new_buffer->ptr, filter_header.numBytes);
	ParquetBloomFilter bloom_filter(std::move(new_buffer));
	return ApplyBloomFilter(duckdb_filter, bloom_filter);
}